

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

long __thiscall
duckdb::VectorDecimalCastOperator<duckdb::TryCastToDecimal>::Operation<duckdb::string_t,long>
          (VectorDecimalCastOperator<duckdb::TryCastToDecimal> *this,string_t input,
          ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  long lVar2;
  string_t input_00;
  long result_value;
  uint8_t in_stack_ffffffffffffffa8;
  allocator local_49;
  long local_48;
  string local_40;
  
  input_00.value._0_8_ = input.value._0_8_;
  input_00.value.pointer.ptr = (char *)&local_48;
  bVar1 = TryCastToDecimal::Operation<duckdb::string_t,long>
                    ((TryCastToDecimal *)this,input_00,*(int64_t **)(idx + 8),
                     (CastParameters *)(ulong)*(byte *)(idx + 0x18),*(uint8_t *)(idx + 0x19),
                     in_stack_ffffffffffffffa8);
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,"Failed to cast decimal value",&local_49);
    lVar2 = HandleVectorCastError::Operation<long>
                      (&local_40,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx);
    ::std::__cxx11::string::~string((string *)&local_40);
    local_48 = lVar2;
  }
  return local_48;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}